

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

int fileOut_object(FILE *fp,object *obj)

{
  int iVar1;
  object *obj_local;
  FILE *fp_local;
  
  iVar1 = fileOut_object_version_3(fp,obj);
  return iVar1;
}

Assistant:

int fileOut_object(FILE *fp, struct object *obj)
{
    return fileOut_object_version_3(fp, obj);
}